

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

wchar_t * fmt::v5::internal::
          parse_arg_id<wchar_t,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>>&,wchar_t>>
                    (wchar_t *begin,wchar_t *end,
                    width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>_>_&,_wchar_t>
                    *handler)

{
  long lVar1;
  wchar_t *pwVar2;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>_>
  *psVar3;
  wchar_t wVar4;
  type tVar5;
  long lVar6;
  basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>
  *this;
  uint arg_id;
  basic_format_specs<wchar_t> *pbVar7;
  basic_string_view<wchar_t> name;
  error_handler local_71;
  width_checker<fmt::v5::internal::error_handler> local_70;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>_1
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>_1
  local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  wVar4 = *begin;
  if ((wVar4 == L'}') || (wVar4 == L':')) {
    pbVar7 = (handler->handler->
             super_specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
             ).super_specs_setter<wchar_t>.specs_;
    basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>
    ::next_arg((format_arg *)&local_68.string,
               (handler->handler->
               super_specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
               ).context_);
LAB_002065cd:
    local_38 = local_58;
    uStack_30 = uStack_50;
    local_48.long_long_value = local_68.long_long_value;
    local_48.string.size = local_68.string.size;
    local_70.handler_ = &local_71;
    tVar5 = visit_format_arg<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
                      (&local_70,
                       (basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                        *)&local_48.string);
    if ((tVar5 & 0xffffffff80000000) != 0) {
      error_handler::on_error(&local_71,"number is too big");
    }
    (pbVar7->super_align_spec).width_ = (uint)tVar5;
  }
  else {
    if ((uint)(wVar4 + L'\xffffffd0') < 10) {
      begin = begin + 1;
      arg_id = 0;
      pwVar2 = begin;
      if (wVar4 != L'0') {
        do {
          begin = pwVar2;
          if (0xccccccc < arg_id) {
            begin = begin + -1;
            arg_id = 0x80000000;
            goto LAB_00206738;
          }
          arg_id = (wVar4 + arg_id * 10) - 0x30;
          if (begin == end) break;
          wVar4 = *begin;
          pwVar2 = begin + 1;
        } while ((uint)(wVar4 + L'\xffffffd0') < 10);
        if ((int)arg_id < 0) {
LAB_00206738:
          error_handler::on_error
                    ((error_handler *)
                     (handler->handler->
                     super_specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                     ).context_,"number is too big");
        }
      }
      if ((begin != end) && ((*begin == L':' || (*begin == L'}')))) {
        psVar3 = handler->handler;
        pbVar7 = (psVar3->
                 super_specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                 ).super_specs_setter<wchar_t>.specs_;
        this = (psVar3->
               super_specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
               ).context_;
        if ((this->
            super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
            ).parse_context_.next_arg_id_ < 1) {
          (this->
          super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
          ).parse_context_.next_arg_id_ = -1;
        }
        else {
          error_handler::on_error
                    ((error_handler *)this,
                     "cannot switch from automatic to manual argument indexing");
          this = (psVar3->
                 super_specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                 ).context_;
        }
        context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
        ::do_get_arg((format_arg *)&local_68.string,
                     &this->
                      super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
                     ,arg_id);
        goto LAB_002065cd;
      }
    }
    else if ((wVar4 == L'_') || ((uint)((wVar4 & 0xffffffdfU) - 0x41U) < 0x1a)) {
      lVar1 = 4;
      do {
        lVar6 = lVar1;
        pwVar2 = (wchar_t *)((long)begin + lVar6);
        if (pwVar2 == end) break;
        wVar4 = *pwVar2;
        lVar1 = lVar6 + 4;
      } while ((((uint)(wVar4 + L'\xffffffd0') < 10) || (wVar4 == L'_')) ||
              ((uint)((wVar4 & 0xffffffdfU) - 0x41U) < 0x1a));
      name.size_ = lVar6 >> 2;
      pbVar7 = (handler->handler->
               super_specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
               ).super_specs_setter<wchar_t>.specs_;
      name.data_ = begin;
      basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>
      ::get_arg((format_arg *)&local_68.string,
                (handler->handler->
                super_specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                ).context_,name);
      local_38 = local_58;
      uStack_30 = uStack_50;
      local_48.long_long_value = local_68.long_long_value;
      local_48.string.size = local_68.string.size;
      local_70.handler_ = &local_71;
      tVar5 = visit_format_arg<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
                        (&local_70,
                         (basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                          *)&local_48.string);
      if ((tVar5 & 0xffffffff80000000) != 0) {
        error_handler::on_error(&local_71,"number is too big");
      }
      (pbVar7->super_align_spec).width_ = (uint)tVar5;
      return pwVar2;
    }
    error_handler::on_error
              ((error_handler *)
               (handler->handler->
               super_specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
               ).context_,"invalid format string");
  }
  return begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}